

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O3

int runChild(char **cmd,int state,int exception,int value,int share,int output,int delay,
            double timeout,int poll,int repeat,int disown,int createNewGroup,uint interruptDelay)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  cmsysProcess *cp;
  char *pcVar5;
  double *userTimeout;
  uint uVar6;
  int length;
  int local_74;
  uint local_70;
  uint local_6c;
  char *local_68;
  uint local_5c;
  double local_58;
  FILE *local_50;
  char **local_48;
  ulong local_40;
  double local_38;
  
  local_70 = state;
  local_6c = share;
  local_58 = timeout;
  local_48 = cmd;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    runChild_cold_1();
    iVar3 = 1;
  }
  else {
    if (repeat < 1) {
LAB_0010320f:
      iVar3 = 1;
    }
    else {
      userTimeout = &local_38;
      if (poll == 0) {
        userTimeout = (double *)0x0;
      }
      local_5c = disown | local_6c;
      do {
        local_40 = (ulong)(uint)repeat;
        local_68 = (char *)0x0;
        local_74 = 0;
        local_38 = 0.0;
        cmsysProcess_SetCommand(cp,local_48);
        if (0.0 <= local_58) {
          cmsysProcess_SetTimeout(cp,local_58);
        }
        if (local_6c != 0) {
          cmsysProcess_SetPipeShared(cp,2,1);
          cmsysProcess_SetPipeShared(cp,3,1);
        }
        if (disown != 0) {
          cmsysProcess_SetOption(cp,1,1);
        }
        if (createNewGroup != 0) {
          cmsysProcess_SetOption(cp,4,1);
        }
        cmsysProcess_Execute(cp);
        if (interruptDelay != 0) {
          sleep(interruptDelay);
          cmsysProcess_Interrupt(cp);
        }
        uVar6 = poll;
        if (local_5c == 0) {
          iVar3 = cmsysProcess_WaitForData(cp,&local_68,&local_74,userTimeout);
          while (iVar3 != 0) {
            uVar4 = uVar6;
            if (output == 0) {
LAB_00102fb9:
              if (uVar4 != 0) goto LAB_00102fc1;
              uVar4 = 0;
            }
            else {
              if (iVar3 != 0xff || uVar6 == 0) {
                fwrite(local_68,1,(long)local_74,_stdout);
                fflush(_stdout);
                goto LAB_00102fb9;
              }
              fwrite("WaitForData timeout reached.\n",0x1d,1,_stdout);
              fflush(_stdout);
              uVar4 = uVar6 + 1;
              if ((int)uVar6 < 0x13) goto LAB_00102fb9;
              fprintf(_stdout,"Poll count reached limit %d.\n",0x14);
              cmsysProcess_Kill(cp);
LAB_00102fc1:
              usleep(100000);
            }
            iVar3 = cmsysProcess_WaitForData(cp,&local_68,&local_74,userTimeout);
            uVar6 = uVar4;
          }
        }
        if (disown == 0) {
          cmsysProcess_WaitForExit(cp,(double *)0x0);
        }
        else {
          cmsysProcess_Disown(cp);
        }
        iVar3 = cmsysProcess_GetState(cp);
        bVar1 = true;
        switch(iVar3) {
        case 0:
          pcVar5 = "No process has been executed.";
          break;
        case 1:
          pcVar5 = cmsysProcess_GetErrorString(cp);
          printf("Error in administrating child process: [%s]\n",pcVar5);
          goto switchD_0010302f_default;
        case 2:
          pcVar5 = cmsysProcess_GetExceptionString(cp);
          printf("Subprocess terminated abnormally: %s\n",pcVar5);
          goto LAB_00103070;
        case 3:
          pcVar5 = "The process is still executing.";
          break;
        case 4:
          uVar4 = cmsysProcess_GetExitValue(cp);
          printf("Subprocess exited with value = %d\n",(ulong)uVar4);
LAB_00103070:
          iVar3 = cmsysProcess_GetExitException(cp);
          if ((iVar3 != exception) || (iVar3 = cmsysProcess_GetExitValue(cp), iVar3 != value)) {
            iVar3 = cmsysProcess_GetExitException(cp);
            pFVar2 = _stderr;
            if (iVar3 != exception) {
              uVar4 = cmsysProcess_GetExitException(cp);
              fprintf(pFVar2,"Mismatch in exit exception.  Should have been %d, was %d.\n",
                      (ulong)(uint)exception,(ulong)uVar4);
            }
            iVar3 = cmsysProcess_GetExitValue(cp);
            if (iVar3 == value) {
              bVar1 = false;
            }
            else {
              local_50 = _stderr;
              uVar4 = cmsysProcess_GetExitValue(cp);
              bVar1 = false;
              fprintf(local_50,"Mismatch in exit value.  Should have been %d, was %d.\n",
                      (ulong)(uint)value,(ulong)uVar4);
            }
          }
          goto switchD_0010302f_default;
        case 5:
          pcVar5 = "Subprocess was killed when timeout expired.";
          break;
        case 6:
          pcVar5 = "Subprocess was killed by parent.";
          break;
        case 7:
          pcVar5 = "Subprocess was disowned.";
          break;
        default:
          goto switchD_0010302f_default;
        }
        puts(pcVar5);
switchD_0010302f_default:
        uVar4 = cmsysProcess_GetState(cp);
        pFVar2 = _stderr;
        if (uVar4 != local_70) {
          uVar4 = cmsysProcess_GetState(cp);
          fprintf(pFVar2,"Mismatch in state.  Should have been %d, was %d.\n",(ulong)local_70,
                  (ulong)uVar4);
          if (uVar6 != 0 && (int)uVar6 < 5) {
LAB_001031ef:
            fprintf(_stderr,"Poll count is %d, which is less than %d.\n",(ulong)uVar6,5);
          }
          goto LAB_0010320f;
        }
        if (uVar6 != 0 && (int)uVar6 < 5) goto LAB_001031ef;
        if (!bVar1) goto LAB_0010320f;
        repeat = (int)local_40 - 1;
      } while (1 < (int)local_40);
      iVar3 = 0;
    }
    cmsysProcess_Delete(cp);
  }
  return iVar3;
}

Assistant:

int runChild(const char* cmd[], int state, int exception, int value, int share,
             int output, int delay, double timeout, int poll, int repeat,
             int disown, int createNewGroup, unsigned int interruptDelay)
{
  int result = 1;
  kwsysProcess* kp = kwsysProcess_New();
  if (!kp) {
    fprintf(stderr, "kwsysProcess_New returned NULL!\n");
    return 1;
  }
  while (repeat-- > 0) {
    result = runChild2(kp, cmd, state, exception, value, share, output, delay,
                       timeout, poll, disown, createNewGroup, interruptDelay);
    if (result) {
      break;
    }
  }
  kwsysProcess_Delete(kp);
  return result;
}